

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O0

uint64_t f64_ulp_dist(double a,double b)

{
  undefined8 local_30;
  uint64_t ub;
  uint64_t ua;
  double b_local;
  double a_local;
  undefined8 local_8;
  
  if ((long)((ulong)b ^ (ulong)a) < 0) {
    local_8 = (long)a + (long)b + 0x80000000;
  }
  else {
    if ((long)a - (long)b < 0) {
      local_30 = (long)b - (long)a;
    }
    else {
      local_30 = (long)a - (long)b;
    }
    local_8 = local_30;
  }
  return local_8;
}

Assistant:

inline uint64_t f64_ulp_dist(double a, double b) {
  uint64_t ua, ub;
  memcpy(&ua, &a, sizeof(ua));
  memcpy(&ub, &b, sizeof(ub));
  if ((int64_t)(ub ^ ua) >= 0)
    return (int64_t)(ua - ub) >= 0 ? (ua - ub) : (ub - ua);
  return ua + ub + 0x80000000;
}